

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O1

void __thiscall
slang::syntax::RsRuleSyntax::setChild(RsRuleSyntax *this,size_t index,TokenOrSyntax child)

{
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> pSVar1;
  SyntaxNode *pSVar2;
  undefined4 uVar3;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar4;
  RsWeightClauseSyntax *pRVar5;
  RandJoinClauseSyntax *pRVar6;
  
  ppSVar4 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                      ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child);
  pSVar1 = *ppSVar4;
  if (index == 2) {
    if (pSVar1 == (variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_>)0x0) {
      pRVar5 = (RsWeightClauseSyntax *)0x0;
    }
    else {
      ppSVar4 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           &child);
      pRVar5 = (RsWeightClauseSyntax *)*ppSVar4;
    }
    this->weightClause = pRVar5;
  }
  else if (index == 1) {
    (this->prods).super_SyntaxListBase.super_SyntaxNode.previewNode = pSVar1->previewNode;
    uVar3 = *(undefined4 *)&pSVar1->field_0x4;
    pSVar2 = pSVar1->parent;
    (this->prods).super_SyntaxListBase.super_SyntaxNode.kind = pSVar1->kind;
    *(undefined4 *)&(this->prods).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar3;
    (this->prods).super_SyntaxListBase.super_SyntaxNode.parent = pSVar2;
    (this->prods).super_SyntaxListBase.childCount = *(size_t *)(pSVar1 + 1);
    pSVar2 = pSVar1[1].previewNode;
    (this->prods).super_span<slang::syntax::RsProdSyntax_*,_18446744073709551615UL>._M_ptr =
         (pointer)pSVar1[1].parent;
    (this->prods).super_span<slang::syntax::RsProdSyntax_*,_18446744073709551615UL>._M_extent.
    _M_extent_value = (size_t)pSVar2;
  }
  else {
    if (pSVar1 == (variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_>)0x0) {
      pRVar6 = (RandJoinClauseSyntax *)0x0;
    }
    else {
      ppSVar4 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           &child);
      pRVar6 = (RandJoinClauseSyntax *)*ppSVar4;
    }
    this->randJoin = pRVar6;
  }
  return;
}

Assistant:

void RsRuleSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: randJoin = child.node() ? &child.node()->as<RandJoinClauseSyntax>() : nullptr; return;
        case 1: prods = child.node()->as<SyntaxList<RsProdSyntax>>(); return;
        case 2: weightClause = child.node() ? &child.node()->as<RsWeightClauseSyntax>() : nullptr; return;
        default: SLANG_UNREACHABLE;
    }
}